

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Objects.c
# Opt level: O3

void Vector_printRange(Vector *vector,uint min,uint max)

{
  if ((vector != (Vector *)0x0 && min <= max) && (max < vector->size)) {
    printf("Array = { ");
    do {
      printf("%3d",(ulong)(uint)vector->a[min]);
      min = min + 1;
    } while (min <= max);
    puts(" }");
    return;
  }
  return;
}

Assistant:

void Vector_printRange(Vector* vector, unsigned int min, unsigned int max) {
    unsigned int i;
    if (min > max || vector == NULL || max >= vector->size)
        return;

    printf("Array = { ");
    for (i = min; i <= max; ++i) {
        printf("%3d", vector->a[i]);
    }
    printf(" }\n");
}